

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZTensor
          (TPZTensor<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *input)

{
  TFad<6,_double> local_58;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_016acd90;
  local_58.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_58.val_ = 0.0;
  local_58.dx_[0] = 0.0;
  local_58.dx_[1] = 0.0;
  local_58.dx_[2] = 0.0;
  local_58.dx_[3] = 0.0;
  local_58.dx_[4] = 0.0;
  local_58.dx_[5] = 0.0;
  TPZManVector<TFad<6,_double>,_6>::TPZManVector(&this->fData,6,&local_58);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_58,input,0,0);
  TFad<6,_double>::operator=((this->fData).super_TPZVec<TFad<6,_double>_>.fStore,&local_58);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_58,input,0,1);
  TFad<6,_double>::operator=((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1,&local_58);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_58,input,0,2);
  TFad<6,_double>::operator=((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2,&local_58);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_58,input,1);
  TFad<6,_double>::operator=((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 3,&local_58);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_58,input,1,2);
  TFad<6,_double>::operator=((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4,&local_58);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_58,input,2);
  TFad<6,_double>::operator=((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 5,&local_58);
  return;
}

Assistant:

TPZTensor(const TPZFMatrix<T> &input) : fData(6, 0.) {
#ifdef PZDEBUG
        if (input.Rows() != 3 || input.Cols() != 3) {
            DebugStop();
        }
        T tol;
        ZeroTolerance(tol);
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                if (fabs(TPZExtractVal::val(input.GetVal(i, j) - input.GetVal(j, i))) > tol) {
                    std::cout << "diff = " << input.GetVal(i, j) - input.GetVal(j, i) << std::endl;
                    DebugStop();
                }
            }
        }
#endif
        fData[_XX_] = input.GetVal(0, 0);
        fData[_XY_] = input.GetVal(0, 1);
        fData[_XZ_] = input.GetVal(0, 2);
        fData[_YY_] = input.GetVal(1, 1);
        fData[_YZ_] = input.GetVal(1, 2);
        fData[_ZZ_] = input.GetVal(2, 2);
    }